

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void __thiscall arm::BrInst::display(BrInst *this,ostream *o)

{
  ostream *poVar1;
  
  display_op((this->super_Inst).op,o);
  display_cond((this->super_Inst).cond,o);
  poVar1 = std::operator<<(o," ");
  std::operator<<(poVar1,(string *)&this->l);
  return;
}

Assistant:

void BrInst::display(std::ostream &o) const {
  display_op(op, o);
  display_cond(cond, o);
  o << " " << l;
}